

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::instruction_to_result_type
          (Compiler *this,uint32_t *result_type,uint32_t *result_id,Op op,uint32_t *args,
          uint32_t length)

{
  SPIRType *pSVar1;
  uint32_t length_local;
  uint32_t *args_local;
  Op op_local;
  uint32_t *result_id_local;
  uint32_t *result_type_local;
  Compiler *this_local;
  
  if ((((((op == OpLine) || (op - OpStore < 3)) || (op == OpImageWrite)) ||
       (((op - OpEmitStreamVertex < 2 || (op - OpControlBarrier < 2)) ||
        ((op == OpAtomicStore || ((op == OpGroupWaitEvents || (op - OpCommitReadPipe < 2)))))))) ||
      (op - OpGroupCommitReadPipe < 2)) ||
     ((((op - OpRetainEvent < 2 || (op - OpSetUserEventStatus < 2)) || (op == OpNoLine)) ||
      (op == OpAtomicFlagClear)))) {
    this_local._7_1_ = false;
  }
  else if ((length < 2) ||
          (pSVar1 = maybe_get<spirv_cross::SPIRType>(this,*args), pSVar1 == (SPIRType *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    *result_type = *args;
    *result_id = args[1];
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::instruction_to_result_type(uint32_t &result_type, uint32_t &result_id, spv::Op op, const uint32_t *args,
                                          uint32_t length)
{
	// Most instructions follow the pattern of <result-type> <result-id> <arguments>.
	// There are some exceptions.
	switch (op)
	{
	case OpStore:
	case OpCopyMemory:
	case OpCopyMemorySized:
	case OpImageWrite:
	case OpAtomicStore:
	case OpAtomicFlagClear:
	case OpEmitStreamVertex:
	case OpEndStreamPrimitive:
	case OpControlBarrier:
	case OpMemoryBarrier:
	case OpGroupWaitEvents:
	case OpRetainEvent:
	case OpReleaseEvent:
	case OpSetUserEventStatus:
	case OpCaptureEventProfilingInfo:
	case OpCommitReadPipe:
	case OpCommitWritePipe:
	case OpGroupCommitReadPipe:
	case OpGroupCommitWritePipe:
	case OpLine:
	case OpNoLine:
		return false;

	default:
		if (length > 1 && maybe_get<SPIRType>(args[0]) != nullptr)
		{
			result_type = args[0];
			result_id = args[1];
			return true;
		}
		else
			return false;
	}
}